

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O2

int __thiscall smf::MidiEventList::markSequence(MidiEventList *this,int sequence)

{
  pointer ppMVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  ppMVar1 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar2 = (ulong)((long)(this->list).
                        super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1) >> 3;
  uVar4 = 0;
  uVar3 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    ppMVar1[uVar4]->seq = sequence + (int)uVar4;
  }
  return sequence + (int)uVar4;
}

Assistant:

int MidiEventList::markSequence(int sequence) {
	for (int i=0; i<getEventCount(); i++) {
		getEvent(i).seq = sequence++;
	}
	return sequence;
}